

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

int __thiscall GF2::MP<9UL,_GF2::MOLex<9UL>_>::Deg(MP<9UL,_GF2::MOLex<9UL>_> *this)

{
  uint uVar1;
  _List_node_base *p_Var2;
  
  if ((this->super_list<GF2::MM<9UL>,_std::allocator<GF2::MM<9UL>_>_>).
      super__List_base<GF2::MM<9UL>,_std::allocator<GF2::MM<9UL>_>_>._M_impl._M_node._M_size == 0) {
    return -1;
  }
  p_Var2 = (_List_node_base *)this;
  uVar1 = 0;
  while( true ) {
    p_Var2 = (((list<GF2::MM<9UL>,_std::allocator<GF2::MM<9UL>_>_> *)&p_Var2->_M_next)->
             super__List_base<GF2::MM<9UL>,_std::allocator<GF2::MM<9UL>_>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)this) break;
    if (uVar1 < (uint)(byte)WW<9ul>::Weight()::_bitsperoctet[*(ulong *)(p_Var2 + 1) >> 8 & 0xff] +
                (uint)(byte)WW<9ul>::Weight()::_bitsperoctet[*(ulong *)(p_Var2 + 1) & 0xff]) {
      uVar1 = (uint)(byte)WW<9ul>::Weight()::_bitsperoctet[*(ulong *)(p_Var2 + 1) >> 8 & 0xff] +
              (uint)(byte)WW<9ul>::Weight()::_bitsperoctet[*(ulong *)(p_Var2 + 1) & 0xff];
    }
  }
  return uVar1;
}

Assistant:

bool IsEmpty() const
	{	
		return Size() == 0;
	}